

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O2

VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RationalConstantType>_>::Lhs>::Node_**>
 __thiscall
Lib::
Stack<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RationalConstantType>_>::Lhs>::Node_**>_>
::pop(Stack<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RationalConstantType>_>::Lhs>::Node_**>_>
      *this)

{
  VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RationalConstantType>_>::Lhs>::Node_**>
  *this_00;
  long lVar1;
  size_t sVar2;
  long in_RSI;
  
  lVar1 = *(long *)(in_RSI + 0x10);
  this_00 = (VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RationalConstantType>_>::Lhs>::Node_**>
             *)(lVar1 + -8);
  *(VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RationalConstantType>_>::Lhs>::Node_**>
    **)(in_RSI + 0x10) = this_00;
  sVar2 = *(size_t *)(lVar1 + -8);
  this->_capacity = sVar2;
  if (sVar2 != 0) {
    *(int *)(sVar2 + 8) = *(int *)(sVar2 + 8) + 1;
  }
  VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RationalConstantType>_>::Lhs>::Node_**>
  ::~VirtualIterator(this_00);
  return (VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RationalConstantType>_>::Lhs>::Node_**>
          )(IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::CoherenceConf<Kernel::NumTraits<Kernel::RationalConstantType>_>::Lhs>::Node_**>
            *)this;
}

Assistant:

inline
  C pop()
  {
    ASS(_cursor > _stack);
    _cursor--;

    C res = std::move(*_cursor);
    _cursor->~C();

    return res;
  }